

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_basetableref.cpp
# Opt level: O2

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind(Binder *this,BaseTableRef *ref)

{
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  string *psVar1;
  size_type *retriever;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar2;
  optional_idx error_context_p;
  CommonTableExpressionInfo *cte;
  ClientContext *context;
  element_type *peVar3;
  pointer pLVar4;
  pointer prVar5;
  bool bVar6;
  __type skip;
  BindingMode BVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  pointer pSVar11;
  pointer pQVar12;
  unique_ptr<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>_> at_clause_p;
  CatalogEntry *pCVar13;
  idx_t iVar14;
  TableCatalogEntry *this_01;
  StatementProperties *this_02;
  undefined4 extraout_var;
  ColumnList *this_03;
  ColumnDefinition *this_04;
  LogicalType *pLVar15;
  DBConfig *pDVar16;
  reference pvVar17;
  ViewCatalogEntry *view;
  Binder *pBVar18;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer this_05;
  BoundSubqueryRef *pBVar19;
  pointer pBVar20;
  undefined4 extraout_var_03;
  type subquery_00;
  Binding *pBVar21;
  pointer pLVar22;
  optional_ptr<duckdb::TableCatalogEntry,_true> oVar23;
  vector<duckdb::ColumnIndex,_true> *bound_column_ids;
  TableCatalogEntry *entry;
  __shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2> *p_Var24;
  type puVar25;
  pointer pBVar26;
  element_type *peVar27;
  FileSystem *pFVar28;
  BinderException *pBVar29;
  InternalException *pIVar30;
  InvalidInputException *this_06;
  char cVar31;
  long in_RDX;
  string *psVar32;
  long lVar33;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar34;
  SubqueryRef *this_07;
  idx_t i;
  ulong uVar35;
  pointer prVar36;
  char *pcVar37;
  ColumnListIterator CVar38;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  mapped_type cteref;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cte_reference;
  __node_base_ptr p_Stack_508;
  idx_t table_index_1;
  optional_ptr<duckdb::Binding,_true> ctebinding;
  pointer pbStack_4f0;
  __node_base local_4d8;
  optional_ptr<duckdb::TableCatalogEntry,_true> table_entry;
  bool local_4c8 [8];
  optional_ptr<duckdb::CatalogEntry,_true> table_or_view;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_4b8;
  string full_path;
  vector<duckdb::LogicalType,_true> return_types;
  idx_t index;
  pointer pCStack_450;
  __node_base local_448;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_440;
  __node_base local_438;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_430;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  return_names;
  unique_ptr<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>,_true> at_clause;
  EntryLookupInfo table_lookup;
  vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_true> found_ctes;
  SubqueryRef subquery;
  optional_ptr<duckdb::BoundParameterMap,_true> local_240;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_208;
  _Any_data local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  string local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  error_context_p.index = ((optional_idx *)(in_RDX + 0x38))->index;
  found_ctes.
  super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  found_ctes.
  super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  found_ctes.
  super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDX + 0x88);
  if ((*(long *)(in_RDX + 0x90) == 0) || (bVar6 = ::std::operator==(__lhs,"recurring"), bVar6)) {
    __lhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDX + 0xa8);
    skip = ::std::operator==(__lhs_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ref[1].table_name.field_2);
    FindCTE((vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_true> *)&subquery,
            (Binder *)ref,__lhs_00,skip);
    ::std::
    vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
    ::_M_move_assign(&found_ctes.
                      super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
                     ,&subquery);
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
                     *)&subquery);
    prVar5 = found_ctes.
             super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (found_ctes.
        super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        found_ctes.
        super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar1 = &ref->schema_name;
      bVar6 = false;
      for (prVar36 = found_ctes.
                     super_vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; prVar36 != prVar5;
          prVar36 = prVar36 + 1) {
        cte = prVar36->_M_data;
        ctebinding = BindContext::GetCTEBinding((BindContext *)psVar1,__lhs_00);
        if (ctebinding.ptr != (Binding *)0x0) {
          pSVar11 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                    ::operator->(&cte->query);
          pQVar12 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
                    operator->(&pSVar11->node);
          if ((pQVar12->type == RECURSIVE_CTE_NODE) || (cte->materialized == CTE_MATERIALIZE_ALWAYS)
             ) {
            index = GenerateTableIndex((Binder *)ref);
            cVar8 = (char)*(undefined4 *)&cte->materialized;
            cVar31 = '\x03';
            if (cVar8 != '\x01') {
              cVar31 = cVar8;
            }
            return_names.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(return_names.
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,cVar31);
            bVar6 = ::std::operator==(__lhs,"recurring");
            if ((bVar6) &&
               ((cte->key_targets).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (cte->key_targets).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)) {
              this_06 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&subquery,
                         "RECURRING can only be used with USING KEY in recursive CTE.",
                         (allocator *)&cte_reference);
              InvalidInputException::InvalidInputException(this_06,(string *)&subquery);
              __cxa_throw(this_06,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            pBVar21 = optional_ptr<duckdb::Binding,_true>::operator->(&ctebinding);
            bVar6 = ::std::operator==(__lhs,"recurring");
            subquery.super_TableRef._vptr_TableRef =
                 (_func_int **)CONCAT71(subquery.super_TableRef._vptr_TableRef._1_7_,bVar6);
            make_uniq<duckdb::BoundCTERef,unsigned_long&,unsigned_long&,duckdb::CTEMaterialize&,bool>
                      ((duckdb *)&return_types,&index,&pBVar21->index,
                       (CTEMaterialize *)&return_names,(bool *)&subquery);
            pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (in_RDX + 0x10);
            if (*(long *)(in_RDX + 0x18) == 0) {
              pbVar34 = __lhs_00;
            }
            ::std::__cxx11::string::string((string *)&subquery,(string *)pbVar34);
            pBVar21 = optional_ptr<duckdb::Binding,_true>::operator->(&ctebinding);
            BindContext::AliasColumnNames
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)&table_lookup,(string *)&subquery,&pBVar21->names,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)(in_RDX + 0x50));
            iVar14 = index;
            pBVar21 = optional_ptr<duckdb::Binding,_true>::operator->(&ctebinding);
            BindContext::AddGenericBinding
                      ((BindContext *)psVar1,iVar14,(string *)&subquery,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)&table_lookup,&pBVar21->types);
            if (*(long *)(in_RDX + 0x90) == 0) {
              ::std::__cxx11::string::string((string *)&cte_reference,(string *)__lhs_00);
            }
            else {
              ::std::operator+(&full_path,__lhs,".");
              ::std::operator+(&cte_reference,&full_path,__lhs_00);
              ::std::__cxx11::string::~string((string *)&full_path);
            }
            p_Var24 = (__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2> *)
                      ::std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)psVar1,&cte_reference);
            ::std::__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2> *)&cteref,p_Var24);
            if ((cteref.internal.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr == (element_type *)0x0) &&
               (bVar6 = ::std::operator==(__lhs,"recurring"), bVar6)) {
              pBVar29 = (BinderException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&full_path,
                         "There is a WITH item named \"%s\", but the recurring table cannot be referenced from this part of the query."
                         ,(allocator *)&table_entry);
              ::std::__cxx11::string::string((string *)&local_50,(string *)__lhs_00);
              BinderException::BinderException<std::__cxx11::string>(pBVar29,&full_path,&local_50);
              __cxa_throw(pBVar29,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            puVar25 = shared_ptr<unsigned_long,_true>::operator*(&cteref);
            *puVar25 = *puVar25 + 1;
            pBVar21 = optional_ptr<duckdb::Binding,_true>::operator->(&ctebinding);
            pBVar26 = unique_ptr<duckdb::BoundCTERef,_std::default_delete<duckdb::BoundCTERef>,_true>
                      ::operator->((unique_ptr<duckdb::BoundCTERef,_std::default_delete<duckdb::BoundCTERef>,_true>
                                    *)&return_types);
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                      (&(pBVar26->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                       &(pBVar21->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
            pBVar26 = unique_ptr<duckdb::BoundCTERef,_std::default_delete<duckdb::BoundCTERef>,_true>
                      ::operator->((unique_ptr<duckdb::BoundCTERef,_std::default_delete<duckdb::BoundCTERef>,_true>
                                    *)&return_types);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&pBVar26->bound_columns,&table_lookup);
            pLVar4 = return_types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
            super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)pLVar4;
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&cteref.internal.
                        super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            ::std::__cxx11::string::~string((string *)&cte_reference);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&table_lookup);
            ::std::__cxx11::string::~string((string *)&subquery);
            if (return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              (**(code **)(*(long *)return_types.
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 8))();
            }
            goto LAB_005fa04e;
          }
        }
        bVar6 = CTEIsAlreadyBound((Binder *)ref,cte);
        if (!bVar6) {
          if (cte->materialized == CTE_MATERIALIZE_ALWAYS) {
            pBVar29 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&subquery,
                       "There is a WITH item named \"%s\", but it cannot be referenced from this part of the query."
                       ,(allocator *)&cte_reference);
            ::std::__cxx11::string::string((string *)&local_70,(string *)__lhs_00);
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar29,(string *)&subquery,&local_70);
            __cxa_throw(pBVar29,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar6 = ::std::operator==(__lhs,"recurring");
          if (bVar6) {
            pBVar29 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&subquery,
                       "There is a WITH item named \"%s\", but the recurring table cannot be referenced from this part of the query."
                       ,(allocator *)&cte_reference);
            ::std::__cxx11::string::string((string *)&local_90,(string *)__lhs_00);
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar29,(string *)&subquery,&local_90);
            __cxa_throw(pBVar29,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pSVar11 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                    ::operator->(&cte->query);
          (*(pSVar11->super_SQLStatement)._vptr_SQLStatement[3])(&local_4b8,pSVar11);
          local_430._M_head_impl = local_4b8._M_head_impl;
          local_4b8._M_head_impl = (SelectStatement *)0x0;
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          local_1b0._M_string_length = 0;
          local_1b0.field_2._M_local_buf[0] = '\0';
          SubqueryRef::SubqueryRef
                    (&subquery,
                     (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                      *)&local_430,&local_1b0);
          ::std::__cxx11::string::~string((string *)&local_1b0);
          if (local_430._M_head_impl != (SelectStatement *)0x0) {
            (*((local_430._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
          }
          local_430._M_head_impl = (SelectStatement *)0x0;
          if (local_4b8._M_head_impl != (SelectStatement *)0x0) {
            (*((local_4b8._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
          }
          local_4b8._M_head_impl = (SelectStatement *)0x0;
          ::std::__cxx11::string::_M_assign((string *)&subquery.super_TableRef.alias);
          pvVar2 = &subquery.super_TableRef.column_name_alias;
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)pvVar2,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)cte);
          for (uVar35 = 0;
              uVar35 < (ulong)(*(long *)(in_RDX + 0x58) - *(long *)(in_RDX + 0x50) >> 5);
              uVar35 = uVar35 + 1) {
            if (uVar35 < (ulong)((long)subquery.super_TableRef.column_name_alias.
                                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)subquery.super_TableRef.column_name_alias.
                                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5)) {
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)(in_RDX + 0x50),uVar35);
              pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ::get<true>(pvVar2,uVar35);
              ::std::__cxx11::string::_M_assign((string *)pvVar17);
            }
            else {
              pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)(in_RDX + 0x50),uVar35);
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)pvVar2,pvVar17);
            }
          }
          Bind(this,(SubqueryRef *)ref,(CommonTableExpressionInfo *)&subquery);
          SubqueryRef::~SubqueryRef(&subquery);
          goto LAB_005fa04e;
        }
        bVar6 = true;
      }
      if (bVar6) {
        BindWithReplacementScan
                  (this,(ClientContext *)ref,
                   (BaseTableRef *)(ref->super_TableRef).alias._M_dataplus._M_p);
        if ((this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
            super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          pBVar29 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&subquery,
                     "Circular reference to CTE \"%s\", There are two possible solutions. \n1. use WITH RECURSIVE to use recursive CTEs. \n2. If you want to use the TABLE name \"%s\" the same as the CTE name, please explicitly add \"SCHEMA\" before table name. You can try \"main.%s\" (main is the duckdb default schema)"
                     ,(allocator *)&cte_reference);
          ::std::__cxx11::string::string((string *)&local_b0,(string *)__lhs_00);
          ::std::__cxx11::string::string((string *)&local_d0,(string *)__lhs_00);
          ::std::__cxx11::string::string((string *)&local_f0,(string *)__lhs_00);
          BinderException::
          BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (pBVar29,(string *)&subquery,&local_b0,&local_d0,&local_f0);
          __cxa_throw(pBVar29,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        goto LAB_005fa04e;
      }
    }
  }
  BindAtClause((Binder *)&at_clause,(optional_ptr<duckdb::AtClause,_true>)ref);
  at_clause_p._M_t.
  super___uniq_ptr_impl<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundAtClause_*,_std::default_delete<duckdb::BoundAtClause>_>.
  super__Head_base<0UL,_duckdb::BoundAtClause_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>,_true,_true>
        )(__uniq_ptr_data<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>,_true,_true>
          )at_clause;
  if (at_clause.super_unique_ptr<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundAtClause_*,_std::default_delete<duckdb::BoundAtClause>_>.
      super__Head_base<0UL,_duckdb::BoundAtClause_*,_false>._M_head_impl ==
      (__uniq_ptr_data<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>,_true,_true>
       )0x0) {
    at_clause_p._M_t.
    super___uniq_ptr_impl<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::BoundAtClause_*,_std::default_delete<duckdb::BoundAtClause>_>.
    super__Head_base<0UL,_duckdb::BoundAtClause_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>,_true,_true>
          )CatalogEntryRetriever::GetAtClause
                     ((CatalogEntryRetriever *)&ref[3].catalog_name._M_string_length);
  }
  psVar1 = (string *)(in_RDX + 0xa8);
  EntryLookupInfo::EntryLookupInfo
            (&table_lookup,TABLE_ENTRY,psVar1,
             (optional_ptr<duckdb::BoundAtClause,_true>)
             at_clause_p._M_t.
             super___uniq_ptr_impl<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::BoundAtClause_*,_std::default_delete<duckdb::BoundAtClause>_>
             .super__Head_base<0UL,_duckdb::BoundAtClause_*,_false>._M_head_impl,
             (QueryErrorContext)error_context_p.index);
  retriever = &ref[3].catalog_name._M_string_length;
  psVar32 = (string *)(in_RDX + 0x68);
  BindSchemaOrCatalog((CatalogEntryRetriever *)retriever,psVar32,__lhs);
  table_or_view =
       CatalogEntryRetriever::GetEntry
                 ((CatalogEntryRetriever *)retriever,psVar32,__lhs,&table_lookup,RETURN_NULL);
  BVar7 = GetBindingMode((Binder *)ref);
  if ((BVar7 == EXTRACT_NAMES) &&
     ((table_or_view.ptr == (CatalogEntry *)0x0 ||
      (pCVar13 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&table_or_view),
      pCVar13->type == TABLE_ENTRY)))) {
    ::std::__cxx11::string::string((string *)&local_1d0,(string *)psVar1);
    AddTableName((Binder *)ref,&local_1d0);
    ::std::__cxx11::string::~string((string *)&local_1d0);
    iVar14 = GenerateTableIndex((Binder *)ref);
    psVar32 = (string *)(in_RDX + 0x10);
    if (*(long *)(in_RDX + 0x18) == 0) {
      psVar32 = psVar1;
    }
    index = iVar14;
    ::std::__cxx11::string::string((string *)&subquery,(string *)psVar32);
    LogicalType::LogicalType((LogicalType *)&cte_reference,INTEGER);
    __l._M_len = 1;
    __l._M_array = (iterator)&cte_reference;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&cteref,__l,
               (allocator_type *)&full_path);
    LogicalType::~LogicalType((LogicalType *)&cte_reference);
    ::std::__cxx11::to_string(&full_path,iVar14);
    ::std::operator+(&cte_reference,"__dummy_col",&full_path);
    __l_00._M_len = 1;
    __l_00._M_array = &cte_reference;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ctebinding,__l_00,(allocator_type *)&return_types);
    ::std::__cxx11::string::~string((string *)&cte_reference);
    ::std::__cxx11::string::~string((string *)&full_path);
    BindContext::AddGenericBinding
              ((BindContext *)&ref->schema_name,iVar14,(string *)&subquery,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)&ctebinding,(vector<duckdb::LogicalType,_true> *)&cteref);
    make_uniq_base<duckdb::BoundTableRef,duckdb::BoundEmptyTableRef,unsigned_long&>
              ((duckdb *)this,&index);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ctebinding);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&cteref);
    this_07 = &subquery;
    goto LAB_005fa03c;
  }
  if (table_or_view.ptr == (CatalogEntry *)0x0) {
    BindWithReplacementScan
              (this,(ClientContext *)ref,
               (BaseTableRef *)(ref->super_TableRef).alias._M_dataplus._M_p);
    if ((this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)
    {
      ReplacementScan::GetFullPath(&full_path,psVar32,__lhs,psVar1);
      context = (ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p;
      StringUtil::Lower((string *)&subquery,&full_path);
      pDVar16 = DBConfig::GetConfig(context);
      if ((pDVar16->options).autoload_known_extensions != true) {
LAB_005fa072:
        ::std::__cxx11::string::~string((string *)&subquery);
        goto LAB_005fa07f;
      }
      pcVar37 = ".parquet";
      lVar33 = 0;
      do {
        if (lVar33 == -0x300) {
          pcVar37 = ".parquet?";
          lVar33 = 0;
          goto LAB_005f9f52;
        }
        ::std::__cxx11::string::string((string *)&cte_reference,pcVar37,(allocator *)&cteref);
        bVar6 = StringUtil::EndsWith((string *)&subquery,&cte_reference);
        ::std::__cxx11::string::~string((string *)&cte_reference);
        lVar33 = lVar33 + -0x60;
        pcVar37 = pcVar37 + 0x60;
      } while (!bVar6);
      ::std::__cxx11::string::string
                ((string *)&cte_reference,
                 "Failed to cast bound query node to type - query node type mismatch" +
                 (0x18 - lVar33),(allocator *)&cteref);
      ExtensionHelper::AutoLoadExtension(context,&cte_reference);
      goto LAB_005f9fbb;
    }
  }
  else {
    pCVar13 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&table_or_view);
    if (pCVar13->type == VIEW_ENTRY) {
      view = (ViewCatalogEntry *)
             optional_ptr<duckdb::CatalogEntry,_true>::operator->(&table_or_view);
      CreateBinder((Binder *)&table_entry,
                   (ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p,
                   (optional_ptr<duckdb::Binder,_true>)ref,VIEW_BINDER);
      pBVar18 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)&table_entry);
      pBVar18->can_contain_nulls = true;
      iVar9 = (*(view->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                _vptr_CatalogEntry[0x10])(view);
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar9) + 0x18))
                (&local_4d8,(long *)CONCAT44(extraout_var_00,iVar9));
      local_440._M_head_impl = (SelectStatement *)local_4d8._M_nxt;
      local_4d8._M_nxt = (_Hash_node_base *)0x0;
      local_1f0._M_unused._M_object = &local_1e0;
      local_1f0._8_8_ = (SQLStatement *)0x0;
      local_1e0._M_local_buf[0] = STANDARD_BINDING;
      SubqueryRef::SubqueryRef
                (&subquery,
                 (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                  *)&local_440,(string *)&local_1f0);
      ::std::__cxx11::string::~string((string *)local_1f0._M_pod_data);
      if (local_440._M_head_impl != (SelectStatement *)0x0) {
        (*(code *)((_Hash_node_base *)
                  ((local_440._M_head_impl)->super_SQLStatement)._vptr_SQLStatement)[1]._M_nxt)();
      }
      local_440._M_head_impl = (SelectStatement *)0x0;
      if (local_4d8._M_nxt != (_Hash_node_base *)0x0) {
        (*(code *)(local_4d8._M_nxt)->_M_nxt[1]._M_nxt)();
      }
      local_4d8._M_nxt = (_Hash_node_base *)0x0;
      psVar32 = &subquery.super_TableRef.alias;
      ::std::__cxx11::string::_M_assign((string *)psVar32);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&ctebinding,
               &(view->aliases).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
      pvVar2 = &view->names;
      for (uVar35 = (long)pbStack_4f0 - (long)ctebinding.ptr >> 5;
          uVar35 < (ulong)((long)(view->names).
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(view->names).
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar35 = uVar35 + 1) {
        pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>(pvVar2,uVar35);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ctebinding,pvVar17);
      }
      BindContext::AliasColumnNames
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&cte_reference,psVar1,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&ctebinding,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)(in_RDX + 0x50));
      pBVar18 = (Binder *)&cte_reference;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&subquery.super_TableRef.column_name_alias);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cte_reference);
      iVar9 = (*(view->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                _vptr_CatalogEntry[0xb])(view);
      iVar10 = (*(view->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                 _vptr_CatalogEntry[0xd])(view);
      GetSearchPath((vector<duckdb::CatalogSearchEntry,_true> *)&index,pBVar18,
                    (Catalog *)CONCAT44(extraout_var_01,iVar9),
                    (string *)(CONCAT44(extraout_var_02,iVar10) + 0x20));
      pBVar18 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)&table_entry);
      local_208.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)index;
      local_208.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = pCStack_450;
      local_208.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_448._M_nxt;
      index = 0;
      pCStack_450 = (pointer)0x0;
      local_448._M_nxt = (__node_base_ptr)0x0;
      CatalogEntryRetriever::SetSearchPath
                (&pBVar18->entry_retriever,(vector<duckdb::CatalogSearchEntry,_true> *)&local_208);
      ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
      ~vector(&local_208);
      pBVar18 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)&table_entry);
      CatalogEntryRetriever::SetAtClause
                (&pBVar18->entry_retriever,
                 (optional_ptr<duckdb::BoundAtClause,_true>)
                 at_clause_p._M_t.
                 super___uniq_ptr_impl<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::BoundAtClause_*,_std::default_delete<duckdb::BoundAtClause>_>
                 .super__Head_base<0UL,_duckdb::BoundAtClause_*,_false>._M_head_impl);
      pBVar18 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)&table_entry);
      AddBoundView(pBVar18,view);
      pBVar18 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)&table_entry);
      Bind(this,(SubqueryRef *)pBVar18,(CommonTableExpressionInfo *)&subquery);
      pBVar18 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)&table_entry);
      if ((pBVar18->correlated_columns).
          super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
          super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pBVar18->correlated_columns).
          super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
          super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar29 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&cte_reference,
                   "Contents of view were altered - view bound correlated columns",
                   (allocator *)&full_path);
        BinderException::BinderException(pBVar29,&cte_reference);
        __cxa_throw(pBVar29,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      this_05 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                ::operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                              *)this);
      pBVar19 = BoundTableRef::Cast<duckdb::BoundSubqueryRef>(this_05);
      BVar7 = GetBindingMode((Binder *)ref);
      if ((BVar7 != EXTRACT_NAMES) &&
         (iVar9 = (*(view->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                    _vptr_CatalogEntry[0x11])(view), (char)iVar9 != '\0')) {
        this_00 = &pBVar19->subquery;
        pBVar20 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                  ::operator->(this_00);
        ExchangeAllNullTypes(&return_types,&pBVar20->types);
        ExchangeAllNullTypes((vector<duckdb::LogicalType,_true> *)&return_names,&view->types);
        bVar6 = ::std::operator!=(&return_types.
                                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ,(vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    *)&return_names);
        if (bVar6) {
          ::std::__cxx11::string::string((string *)&full_path,", ",(allocator *)&cteref);
          StringUtil::ToString<duckdb::LogicalType>(&cte_reference,&return_types,&full_path);
          ::std::__cxx11::string::~string((string *)&full_path);
          ::std::__cxx11::string::string((string *)&cteref,", ",(allocator *)&table_index_1);
          StringUtil::ToString<duckdb::LogicalType>
                    (&full_path,(vector<duckdb::LogicalType,_true> *)&return_names,(string *)&cteref
                    );
          ::std::__cxx11::string::~string((string *)&cteref);
          pBVar29 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&cteref,
                     "Contents of view were altered: types don\'t match! Expected [%s], but found [%s] instead"
                     ,(allocator *)&table_index_1);
          ::std::__cxx11::string::string((string *)&local_130,(string *)&full_path);
          ::std::__cxx11::string::string((string *)&local_150,(string *)&cte_reference);
          BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                    (pBVar29,(string *)&cteref,&local_130,&local_150);
          __cxa_throw(pBVar29,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pBVar20 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                  ::operator->(this_00);
        if ((long)(pBVar20->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pBVar20->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
            (long)(view->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(view->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
          pBVar20 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                    ::operator->(this_00);
          bVar6 = ::std::operator!=(&(pBVar20->names).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ,&pvVar2->
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   );
          if (bVar6) {
            pBVar20 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                      ::operator->(this_00);
            ::std::__cxx11::string::string((string *)&full_path,", ",(allocator *)&cteref);
            StringUtil::Join(&cte_reference,&pBVar20->names,&full_path);
            ::std::__cxx11::string::~string((string *)&full_path);
            ::std::__cxx11::string::string((string *)&cteref,", ",(allocator *)&table_index_1);
            StringUtil::Join(&full_path,pvVar2,(string *)&cteref);
            ::std::__cxx11::string::~string((string *)&cteref);
            pBVar29 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&cteref,
                       "Contents of view were altered: names don\'t match! Expected [%s], but found [%s] instead"
                       ,(allocator *)&table_index_1);
            ::std::__cxx11::string::string((string *)&local_170,(string *)&full_path);
            ::std::__cxx11::string::string((string *)&local_190,(string *)&cte_reference);
            BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                      (pBVar29,(string *)&cteref,&local_170,&local_190);
            __cxa_throw(pBVar29,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   &return_names);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&return_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      }
      pBVar20 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar19->subquery);
      iVar9 = (*pBVar20->_vptr_BoundQueryNode[2])(pBVar20);
      subquery_00 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                    ::operator*(&pBVar19->subquery);
      BindContext::AddView
                ((BindContext *)&ref->schema_name,CONCAT44(extraout_var_03,iVar9),psVar32,&subquery,
                 subquery_00,view);
      ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
      ~vector((vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> *)
              &index);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ctebinding);
      SubqueryRef::~SubqueryRef(&subquery);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4c8);
    }
    else {
      if (pCVar13->type != TABLE_ENTRY) {
        pIVar30 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&subquery,"Catalog entry type",(allocator *)&cte_reference);
        InternalException::InternalException(pIVar30,(string *)&subquery);
        __cxa_throw(pIVar30,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      table_index_1 = GenerateTableIndex((Binder *)ref);
      this_01 = (TableCatalogEntry *)
                optional_ptr<duckdb::CatalogEntry,_true>::operator->(&table_or_view);
      this_02 = GetStatementProperties((Binder *)ref);
      iVar9 = (*(this_01->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                _vptr_CatalogEntry[0xb])();
      StatementProperties::RegisterDBRead
                (this_02,(Catalog *)CONCAT44(extraout_var,iVar9),
                 (ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p);
      local_438._M_nxt = (_Hash_node_base *)0x0;
      (*(this_01->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
        [0x14])(&subquery,this_01,(ref->super_TableRef).alias._M_dataplus._M_p,&local_438,
                &table_lookup);
      cteref.internal.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      cteref.internal.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ctebinding.ptr = (Binding *)0x0;
      index = 0;
      pCStack_450 = (pointer)0x0;
      local_448._M_nxt = (__node_base_ptr)0x0;
      return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      return_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      return_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_03 = TableCatalogEntry::GetColumns(this_01);
      CVar38 = ColumnList::Logical(this_03);
      table_entry.ptr = (TableCatalogEntry *)CVar38.list;
      local_4c8[0] = CVar38.physical;
      ColumnList::ColumnListIterator::begin
                ((ColumnLogicalIteratorInternal *)&cte_reference,(ColumnListIterator *)&table_entry)
      ;
      ColumnList::ColumnListIterator::end
                ((ColumnLogicalIteratorInternal *)&full_path,(ColumnListIterator *)&table_entry);
      while (((cte_reference.field_2._M_allocated_capacity !=
               full_path.field_2._M_allocated_capacity ||
              (cte_reference.field_2._8_8_ != full_path.field_2._8_8_)) ||
             (cte_reference._M_dataplus._M_p != full_path._M_dataplus._M_p))) {
        this_04 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                            ((ColumnLogicalIteratorInternal *)&cte_reference);
        pLVar15 = ColumnDefinition::Type(this_04);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&cteref,
                   pLVar15);
        psVar32 = ColumnDefinition::Name_abi_cxx11_(this_04);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ctebinding,psVar32);
        pLVar15 = ColumnDefinition::Type(this_04);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&return_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,pLVar15)
        ;
        psVar32 = ColumnDefinition::Name_abi_cxx11_(this_04);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&return_names,psVar32);
        cte_reference.field_2._M_allocated_capacity =
             cte_reference.field_2._M_allocated_capacity + 1;
      }
      BindContext::AliasColumnNames
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&cte_reference,psVar1,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&ctebinding,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)(in_RDX + 0x50));
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&ctebinding,&cte_reference);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cte_reference);
      cte_reference._M_dataplus._M_p = (pointer)&p_Stack_508;
      cte_reference._M_string_length = 1;
      cte_reference.field_2._M_allocated_capacity = 0;
      cte_reference.field_2._8_8_ = 0;
      p_Stack_508 = (__node_base_ptr)0x0;
      if (local_240.ptr == (BoundParameterMap *)0x0) {
        (*(this_01->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
          [0x19])(&full_path);
      }
      else {
        (*(code *)local_240.ptr)
                  (&full_path,(ref->super_TableRef).alias._M_dataplus._M_p,local_438._M_nxt);
      }
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::operator=((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&cte_reference,
                  (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&full_path);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&full_path);
      make_uniq<duckdb::LogicalGet,unsigned_long&,duckdb::TableFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::vector<duckdb::LogicalType,true>,duckdb::vector<std::__cxx11::string,true>,std::unordered_map<unsigned_long,duckdb::TableColumn,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>>>
                ((duckdb *)&full_path,&table_index_1,(TableFunction *)&subquery,
                 (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)&local_438,&return_types,&return_names,
                 (unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                  *)&cte_reference);
      pLVar22 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                            *)&full_path);
      oVar23 = LogicalGet::GetTable(pLVar22);
      table_entry.ptr = oVar23.ptr;
      pLVar22 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                            *)&full_path);
      bound_column_ids = LogicalGet::GetMutableColumnIds(pLVar22);
      iVar14 = table_index_1;
      if (oVar23.ptr == (TableCatalogEntry *)0x0) {
        BindContext::AddBaseTable
                  ((BindContext *)&ref->schema_name,table_index_1,(string *)(in_RDX + 0x10),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)&ctebinding,(vector<duckdb::LogicalType,_true> *)&cteref,bound_column_ids,
                   psVar1);
      }
      else {
        entry = optional_ptr<duckdb::TableCatalogEntry,_true>::operator*(&table_entry);
        BindContext::AddBaseTable
                  ((BindContext *)&ref->schema_name,iVar14,(string *)(in_RDX + 0x10),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)&ctebinding,(vector<duckdb::LogicalType,_true> *)&cteref,bound_column_ids,
                   entry,true);
      }
      make_uniq_base<duckdb::BoundTableRef,duckdb::BoundBaseTableRef,duckdb::TableCatalogEntry&,duckdb::unique_ptr<duckdb::LogicalGet,std::default_delete<duckdb::LogicalGet>,true>>
                ((duckdb *)this,this_01,
                 (unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> *)
                 &full_path);
      if (full_path._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)full_path._M_dataplus._M_p + 8))();
      }
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&cte_reference);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&return_names);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                (&return_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      ::std::_Vector_base<duckdb::TableColumnType,_std::allocator<duckdb::TableColumnType>_>::
      ~_Vector_base((_Vector_base<duckdb::TableColumnType,_std::allocator<duckdb::TableColumnType>_>
                     *)&index);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ctebinding);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&cteref);
      TableFunction::~TableFunction((TableFunction *)&subquery);
      if (local_438._M_nxt != (_Hash_node_base *)0x0) {
        (*(code *)(local_438._M_nxt)->_M_nxt[1]._M_nxt)();
      }
    }
  }
  goto LAB_005fa041;
  while( true ) {
    ::std::__cxx11::string::string((string *)&cte_reference,pcVar37,(allocator *)&cteref);
    bVar6 = StringUtil::Contains((string *)&subquery,&cte_reference);
    ::std::__cxx11::string::~string((string *)&cte_reference);
    lVar33 = lVar33 + -0x60;
    pcVar37 = pcVar37 + 0x60;
    if (bVar6) break;
LAB_005f9f52:
    if (lVar33 == -0x180) goto LAB_005fa072;
  }
  ::std::__cxx11::string::string((string *)&cte_reference,"excel" + -lVar33,(allocator *)&cteref);
  ExtensionHelper::AutoLoadExtension(context,&cte_reference);
LAB_005f9fbb:
  ::std::__cxx11::string::~string((string *)&cte_reference);
  ::std::__cxx11::string::~string((string *)&subquery);
  BindWithReplacementScan
            ((Binder *)&subquery,(ClientContext *)ref,
             (BaseTableRef *)(ref->super_TableRef).alias._M_dataplus._M_p);
  peVar27 = (element_type *)subquery.super_TableRef._vptr_TableRef;
  subquery.super_TableRef._vptr_TableRef = (_func_int **)0x0;
  peVar3 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
           super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar27;
  if (peVar3 != (element_type *)0x0) {
    (**(code **)(*(long *)&(peVar3->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ + 8)
    )();
    if (subquery.super_TableRef._vptr_TableRef != (_func_int **)0x0) {
      (**(code **)(*subquery.super_TableRef._vptr_TableRef + 8))();
    }
    peVar27 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar27 == (element_type *)0x0) {
LAB_005fa07f:
    pDVar16 = DBConfig::GetConfig((ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p);
    if ((((ref->super_TableRef).alias._M_dataplus._M_p[0xec] == '\x01') &&
        ((pDVar16->options).enable_external_access == true)) &&
       (bVar6 = ExtensionHelper::IsFullPath(&full_path), bVar6)) {
      pFVar28 = FileSystem::GetFileSystem
                          ((ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p);
      iVar9 = (*pFVar28->_vptr_FileSystem[0x12])(pFVar28,&full_path,0);
      if ((char)iVar9 != '\0') {
        pBVar29 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&subquery,
                   "No extension found that is capable of reading the file \"%s\"\n* If this file is a supported file format you can explicitly use the reader functions, such as read_csv, read_json or read_parquet"
                   ,(allocator *)&cte_reference);
        ::std::__cxx11::string::string((string *)&local_110,(string *)&full_path);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar29,(string *)&subquery,&local_110);
        __cxa_throw(pBVar29,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    CatalogEntryRetriever::GetEntry
              ((CatalogEntryRetriever *)retriever,psVar32,__lhs,&table_lookup,THROW_EXCEPTION);
    pIVar30 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&subquery,"Catalog::GetEntry should have thrown an exception above",
               (allocator *)&cte_reference);
    InternalException::InternalException(pIVar30,(string *)&subquery);
    __cxa_throw(pIVar30,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_07 = (SubqueryRef *)&full_path;
LAB_005fa03c:
  ::std::__cxx11::string::~string((string *)this_07);
LAB_005fa041:
  ::std::unique_ptr<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>_>::~unique_ptr
            (&at_clause.
              super_unique_ptr<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>_>);
LAB_005fa04e:
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>_>
                   *)&found_ctes);
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(BaseTableRef &ref) {
	QueryErrorContext error_context(ref.query_location);
	// CTEs and views are also referred to using BaseTableRefs, hence need to distinguish here
	// check if the table name refers to a CTE

	// CTE name should never be qualified (i.e. schema_name should be empty)
	// unless we want to refer to the recurring table of "using key".
	vector<reference<CommonTableExpressionInfo>> found_ctes;
	if (ref.schema_name.empty() || ref.schema_name == "recurring") {
		found_ctes = FindCTE(ref.table_name, ref.table_name == alias);
	}

	if (!found_ctes.empty()) {
		// Check if there is a CTE binding in the BindContext
		bool circular_cte = false;
		for (auto found_cte : found_ctes) {
			auto &cte = found_cte.get();
			auto ctebinding = bind_context.GetCTEBinding(ref.table_name);
			if (ctebinding && (cte.query->node->type == QueryNodeType::RECURSIVE_CTE_NODE ||
			                   cte.materialized == CTEMaterialize::CTE_MATERIALIZE_ALWAYS)) {
				// There is a CTE binding in the BindContext.
				// This can only be the case if there is a recursive CTE,
				// or a materialized CTE present.
				auto index = GenerateTableIndex();
				auto materialized = cte.materialized;
				if (materialized == CTEMaterialize::CTE_MATERIALIZE_DEFAULT) {
#ifdef DUCKDB_ALTERNATIVE_VERIFY
					materialized = CTEMaterialize::CTE_MATERIALIZE_ALWAYS;
#else
					materialized = CTEMaterialize::CTE_MATERIALIZE_NEVER;
#endif
				}

				if (ref.schema_name == "recurring" && cte.key_targets.empty()) {
					throw InvalidInputException("RECURRING can only be used with USING KEY in recursive CTE.");
				}

				auto result =
				    make_uniq<BoundCTERef>(index, ctebinding->index, materialized, ref.schema_name == "recurring");
				auto alias = ref.alias.empty() ? ref.table_name : ref.alias;
				auto names = BindContext::AliasColumnNames(alias, ctebinding->names, ref.column_name_alias);

				bind_context.AddGenericBinding(index, alias, names, ctebinding->types);

				auto cte_reference = ref.schema_name.empty() ? ref.table_name : ref.schema_name + "." + ref.table_name;

				// Update references to CTE
				auto cteref = bind_context.cte_references[cte_reference];

				if (cteref == nullptr && ref.schema_name == "recurring") {
					throw BinderException("There is a WITH item named \"%s\", but the recurring table cannot be "
					                      "referenced from this part of the query.",
					                      ref.table_name);
				}

				(*cteref)++;

				result->types = ctebinding->types;
				result->bound_columns = std::move(names);
				return std::move(result);
			} else {
				if (CTEIsAlreadyBound(cte)) {
					// remember error state
					circular_cte = true;
					// retry with next candidate CTE
					continue;
				}

				// If we have found a materialized CTE, but no corresponding CTE binding,
				// something is wrong.
				if (cte.materialized == CTEMaterialize::CTE_MATERIALIZE_ALWAYS) {
					throw BinderException(
					    "There is a WITH item named \"%s\", but it cannot be referenced from this part of the query.",
					    ref.table_name);
				}

				if (ref.schema_name == "recurring") {
					throw BinderException("There is a WITH item named \"%s\", but the recurring table cannot be "
					                      "referenced from this part of the query.",
					                      ref.table_name);
				}

				// Move CTE to subquery and bind recursively
				SubqueryRef subquery(unique_ptr_cast<SQLStatement, SelectStatement>(cte.query->Copy()));
				subquery.alias = ref.alias.empty() ? ref.table_name : ref.alias;
				subquery.column_name_alias = cte.aliases;
				for (idx_t i = 0; i < ref.column_name_alias.size(); i++) {
					if (i < subquery.column_name_alias.size()) {
						subquery.column_name_alias[i] = ref.column_name_alias[i];
					} else {
						subquery.column_name_alias.push_back(ref.column_name_alias[i]);
					}
				}
				return Bind(subquery, &found_cte.get());
			}
		}
		if (circular_cte) {
			auto replacement_scan_bind_result = BindWithReplacementScan(context, ref);
			if (replacement_scan_bind_result) {
				return replacement_scan_bind_result;
			}

			throw BinderException(
			    "Circular reference to CTE \"%s\", There are two possible solutions. \n1. use WITH RECURSIVE to "
			    "use recursive CTEs. \n2. If "
			    "you want to use the TABLE name \"%s\" the same as the CTE name, please explicitly add "
			    "\"SCHEMA\" before table name. You can try \"main.%s\" (main is the duckdb default schema)",
			    ref.table_name, ref.table_name, ref.table_name);
		}
	}
	// not a CTE
	// extract a table or view from the catalog
	auto at_clause = BindAtClause(ref.at_clause);
	auto entry_at_clause = at_clause ? at_clause.get() : entry_retriever.GetAtClause();
	EntryLookupInfo table_lookup(CatalogType::TABLE_ENTRY, ref.table_name, entry_at_clause, error_context);
	BindSchemaOrCatalog(entry_retriever, ref.catalog_name, ref.schema_name);
	auto table_or_view =
	    entry_retriever.GetEntry(ref.catalog_name, ref.schema_name, table_lookup, OnEntryNotFound::RETURN_NULL);
	// we still didn't find the table
	if (GetBindingMode() == BindingMode::EXTRACT_NAMES) {
		if (!table_or_view || table_or_view->type == CatalogType::TABLE_ENTRY) {
			// if we are in EXTRACT_NAMES, we create a dummy table ref
			AddTableName(ref.table_name);

			// add a bind context entry
			auto table_index = GenerateTableIndex();
			auto alias = ref.alias.empty() ? ref.table_name : ref.alias;
			vector<LogicalType> types {LogicalType::INTEGER};
			vector<string> names {"__dummy_col" + to_string(table_index)};
			bind_context.AddGenericBinding(table_index, alias, names, types);
			return make_uniq_base<BoundTableRef, BoundEmptyTableRef>(table_index);
		}
	}
	if (!table_or_view) {
		// table could not be found: try to bind a replacement scan
		// Try replacement scan bind
		auto replacement_scan_bind_result = BindWithReplacementScan(context, ref);
		if (replacement_scan_bind_result) {
			return replacement_scan_bind_result;
		}

		// Try autoloading an extension, then retry the replacement scan bind
		auto full_path = ReplacementScan::GetFullPath(ref.catalog_name, ref.schema_name, ref.table_name);
		auto extension_loaded = TryLoadExtensionForReplacementScan(context, full_path);
		if (extension_loaded) {
			replacement_scan_bind_result = BindWithReplacementScan(context, ref);
			if (replacement_scan_bind_result) {
				return replacement_scan_bind_result;
			}
		}
		auto &config = DBConfig::GetConfig(context);
		if (context.config.use_replacement_scans && config.options.enable_external_access &&
		    ExtensionHelper::IsFullPath(full_path)) {
			auto &fs = FileSystem::GetFileSystem(context);
			if (fs.FileExists(full_path)) {
				throw BinderException(
				    "No extension found that is capable of reading the file \"%s\"\n* If this file is a supported file "
				    "format you can explicitly use the reader functions, such as read_csv, read_json or read_parquet",
				    full_path);
			}
		}

		// could not find an alternative: bind again to get the error
		(void)entry_retriever.GetEntry(ref.catalog_name, ref.schema_name, table_lookup,
		                               OnEntryNotFound::THROW_EXCEPTION);
		throw InternalException("Catalog::GetEntry should have thrown an exception above");
	}

	switch (table_or_view->type) {
	case CatalogType::TABLE_ENTRY: {
		// base table: create the BoundBaseTableRef node
		auto table_index = GenerateTableIndex();
		auto &table = table_or_view->Cast<TableCatalogEntry>();

		auto &properties = GetStatementProperties();
		properties.RegisterDBRead(table.ParentCatalog(), context);

		unique_ptr<FunctionData> bind_data;
		auto scan_function = table.GetScanFunction(context, bind_data, table_lookup);
		// TODO: bundle the type and name vector in a struct (e.g PackedColumnMetadata)
		vector<LogicalType> table_types;
		vector<string> table_names;
		vector<TableColumnType> table_categories;

		vector<LogicalType> return_types;
		vector<string> return_names;
		for (auto &col : table.GetColumns().Logical()) {
			table_types.push_back(col.Type());
			table_names.push_back(col.Name());
			return_types.push_back(col.Type());
			return_names.push_back(col.Name());
		}
		table_names = BindContext::AliasColumnNames(ref.table_name, table_names, ref.column_name_alias);

		virtual_column_map_t virtual_columns;
		if (scan_function.get_virtual_columns) {
			virtual_columns = scan_function.get_virtual_columns(context, bind_data.get());
		} else {
			virtual_columns = table.GetVirtualColumns();
		}
		auto logical_get =
		    make_uniq<LogicalGet>(table_index, scan_function, std::move(bind_data), std::move(return_types),
		                          std::move(return_names), std::move(virtual_columns));
		auto table_entry = logical_get->GetTable();
		auto &col_ids = logical_get->GetMutableColumnIds();
		if (!table_entry) {
			bind_context.AddBaseTable(table_index, ref.alias, table_names, table_types, col_ids, ref.table_name);
		} else {
			bind_context.AddBaseTable(table_index, ref.alias, table_names, table_types, col_ids, *table_entry);
		}
		return make_uniq_base<BoundTableRef, BoundBaseTableRef>(table, std::move(logical_get));
	}
	case CatalogType::VIEW_ENTRY: {
		// the node is a view: get the query that the view represents
		auto &view_catalog_entry = table_or_view->Cast<ViewCatalogEntry>();
		// We need to use a new binder for the view that doesn't reference any CTEs
		// defined for this binder so there are no collisions between the CTEs defined
		// for the view and for the current query
		auto view_binder = Binder::CreateBinder(context, this, BinderType::VIEW_BINDER);
		view_binder->can_contain_nulls = true;
		SubqueryRef subquery(unique_ptr_cast<SQLStatement, SelectStatement>(view_catalog_entry.GetQuery().Copy()));
		subquery.alias = ref.alias;
		// construct view names by first (1) taking the view aliases, (2) adding the view names, then (3) applying
		// subquery aliases
		vector<string> view_names = view_catalog_entry.aliases;
		for (idx_t n = view_names.size(); n < view_catalog_entry.names.size(); n++) {
			view_names.push_back(view_catalog_entry.names[n]);
		}
		subquery.column_name_alias = BindContext::AliasColumnNames(ref.table_name, view_names, ref.column_name_alias);

		// when binding a view, we always look into the catalog/schema where the view is stored first
		auto view_search_path =
		    GetSearchPath(view_catalog_entry.ParentCatalog(), view_catalog_entry.ParentSchema().name);
		view_binder->entry_retriever.SetSearchPath(std::move(view_search_path));
		// propagate the AT clause through the view
		view_binder->entry_retriever.SetAtClause(entry_at_clause);

		// bind the child subquery
		view_binder->AddBoundView(view_catalog_entry);
		auto bound_child = view_binder->Bind(subquery);
		if (!view_binder->correlated_columns.empty()) {
			throw BinderException("Contents of view were altered - view bound correlated columns");
		}

		D_ASSERT(bound_child->type == TableReferenceType::SUBQUERY);
		// verify that the types and names match up with the expected types and names if the view has type info defined
		auto &bound_subquery = bound_child->Cast<BoundSubqueryRef>();
		if (GetBindingMode() != BindingMode::EXTRACT_NAMES && view_catalog_entry.HasTypes()) {
			// we bind the view subquery and the original view with different "can_contain_nulls",
			// but we don't want to throw an error when SQLNULL does not match up with INTEGER,
			// so we exchange all SQLNULL with INTEGER here before comparing
			auto bound_types = ExchangeAllNullTypes(bound_subquery.subquery->types);
			auto view_types = ExchangeAllNullTypes(view_catalog_entry.types);
			if (bound_types != view_types) {
				auto actual_types = StringUtil::ToString(bound_types, ", ");
				auto expected_types = StringUtil::ToString(view_types, ", ");
				throw BinderException(
				    "Contents of view were altered: types don't match! Expected [%s], but found [%s] instead",
				    expected_types, actual_types);
			}
			if (bound_subquery.subquery->names.size() == view_catalog_entry.names.size() &&
			    bound_subquery.subquery->names != view_catalog_entry.names) {
				auto actual_names = StringUtil::Join(bound_subquery.subquery->names, ", ");
				auto expected_names = StringUtil::Join(view_catalog_entry.names, ", ");
				throw BinderException(
				    "Contents of view were altered: names don't match! Expected [%s], but found [%s] instead",
				    expected_names, actual_names);
			}
		}
		bind_context.AddView(bound_subquery.subquery->GetRootIndex(), subquery.alias, subquery,
		                     *bound_subquery.subquery, view_catalog_entry);
		return bound_child;
	}
	default:
		throw InternalException("Catalog entry type");
	}
}